

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int notation2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  if (tok == 0xf) {
    state_local._4_4_ = 0x11;
  }
  else if (tok == 0x1b) {
    state->handler = notation4;
    state_local._4_4_ = 0x15;
  }
  else {
    state_local._4_4_ = common(state,tok);
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
notation2(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
          const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NOTATION_NONE;
  case XML_TOK_LITERAL:
    state->handler = notation4;
    return XML_ROLE_NOTATION_PUBLIC_ID;
  }
  return common(state, tok);
}